

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-connect-multiple.c
# Opt level: O3

int run_test_pipe_connect_close_multiple(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_loop_t *loop;
  uv_pipe_t *handle;
  int iVar2;
  uv_stream_t *server;
  uv_handle_t *handle_00;
  long lVar3;
  client_t *unaff_R14;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_68 [56];
  uv_handle_t *local_30;
  
  iVar2 = (int)auStack_68 + 0x30;
  auStack_68._40_8_ = (uv__queue *)0x1adc50;
  loop = uv_default_loop();
  auStack_68._40_8_ = (uv__queue *)0x1adc64;
  iVar1 = uv_pipe_init(loop,&server_handle,0);
  local_30 = (uv_handle_t *)(long)iVar1;
  auStack_68._48_8_ = (uv_handle_t *)0x0;
  if (local_30 == (uv_handle_t *)0x0) {
    auStack_68._40_8_ = (uv__queue *)0x1adc95;
    iVar1 = uv_pipe_bind(&server_handle,"/tmp/uv-test-sock");
    local_30 = (uv_handle_t *)(long)iVar1;
    auStack_68._48_8_ = (uv_handle_t *)0x0;
    if (local_30 != (uv_handle_t *)0x0) goto LAB_001ade31;
    auStack_68._40_8_ = (uv__queue *)0x1adccb;
    iVar1 = uv_listen((uv_stream_t *)&server_handle,0x80,connection_cb2);
    local_30 = (uv_handle_t *)(long)iVar1;
    auStack_68._48_8_ = (uv_handle_t *)0x0;
    if (local_30 != (uv_handle_t *)0x0) goto LAB_001ade3e;
    unaff_R14 = clients;
    lVar3 = 10;
    local_30 = (uv_handle_t *)0x0;
    do {
      auStack_68._40_8_ = (uv__queue *)0x1add11;
      iVar1 = uv_pipe_init(loop,&unaff_R14->pipe_handle,0);
      local_30 = (uv_handle_t *)(long)iVar1;
      auStack_68._48_8_ = (uv_handle_t *)0x0;
      if (local_30 != (uv_handle_t *)0x0) {
        auStack_68._40_8_ = (uv__queue *)0x1ade24;
        run_test_pipe_connect_close_multiple_cold_4();
        goto LAB_001ade24;
      }
      auStack_68._40_8_ = (uv__queue *)0x1add44;
      uv_pipe_connect(&unaff_R14->conn_req,&unaff_R14->pipe_handle,"/tmp/uv-test-sock",connect_cb2);
      unaff_R14 = unaff_R14 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    lVar3 = 0;
    do {
      auStack_68._40_8_ = (uv__queue *)0x1add65;
      uv_close((uv_handle_t *)((long)&clients[0].pipe_handle.data + lVar3),(uv_close_cb)0x0);
      lVar3 = lVar3 + 0x150;
    } while (lVar3 != 0xd20);
    auStack_68._40_8_ = (uv__queue *)0x1add7f;
    uv_run(loop,UV_RUN_DEFAULT);
    local_30 = (uv_handle_t *)(long)connection_cb_called;
    auStack_68._48_8_ = (uv_handle_t *)0xa;
    unaff_R14 = (client_t *)0xd20;
    if (local_30 != (uv_handle_t *)0xa) goto LAB_001ade4b;
    local_30 = (uv_handle_t *)(long)connect_cb_called;
    auStack_68._48_8_ = (uv_handle_t *)0xa;
    if (local_30 != (uv_handle_t *)0xa) goto LAB_001ade58;
    auStack_68._40_8_ = (uv__queue *)0x1addd6;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    auStack_68._40_8_ = (uv__queue *)0x1adde0;
    uv_run(loop,UV_RUN_DEFAULT);
    local_30 = (uv_handle_t *)0x0;
    auStack_68._40_8_ = (uv__queue *)0x1addf1;
    iVar1 = uv_loop_close(loop);
    auStack_68._48_8_ = SEXT48(iVar1);
    if (local_30 == (uv_handle_t *)auStack_68._48_8_) {
      auStack_68._40_8_ = (uv__queue *)0x1ade07;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
LAB_001ade24:
    auStack_68._40_8_ = (uv__queue *)0x1ade31;
    run_test_pipe_connect_close_multiple_cold_1();
LAB_001ade31:
    auStack_68._40_8_ = (uv__queue *)0x1ade3e;
    run_test_pipe_connect_close_multiple_cold_2();
LAB_001ade3e:
    auStack_68._40_8_ = (uv__queue *)0x1ade4b;
    run_test_pipe_connect_close_multiple_cold_3();
LAB_001ade4b:
    auStack_68._40_8_ = (uv__queue *)0x1ade58;
    run_test_pipe_connect_close_multiple_cold_5();
LAB_001ade58:
    auStack_68._40_8_ = (uv__queue *)0x1ade65;
    run_test_pipe_connect_close_multiple_cold_6();
  }
  server = (uv_stream_t *)&stack0xffffffffffffffd0;
  auStack_68._40_8_ = connection_cb2;
  run_test_pipe_connect_close_multiple_cold_7();
  auStack_68._24_8_ = SEXT48(iVar2);
  auStack_68._16_8_ = 0;
  auStack_68._32_8_ = loop;
  auStack_68._40_8_ = unaff_R14;
  if ((uv_close_cb)auStack_68._24_8_ == (uv_close_cb)0x0) {
    handle = connections + connection_cb_called;
    auStack_68._0_8_ = (void *)0x1adec3;
    iVar1 = uv_pipe_init(server->loop,handle,0);
    auStack_68._24_8_ = SEXT48(iVar1);
    auStack_68._16_8_ = 0;
    if ((uv_close_cb)auStack_68._24_8_ == (uv_close_cb)0x0) {
      auStack_68._0_8_ = (void *)0x1adeea;
      iVar1 = uv_accept(server,(uv_stream_t *)handle);
      auStack_68._24_8_ = SEXT48(iVar1);
      auStack_68._16_8_ = 0;
      if ((uv_close_cb)auStack_68._24_8_ == (uv_close_cb)0x0) {
        auStack_68._0_8_ = (void *)0x1adf10;
        uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
        connection_cb_called = connection_cb_called + 1;
        if ((connection_cb_called == 10) && (connect_cb_called == 10)) {
          uv_close((uv_handle_t *)&server_handle,(uv_close_cb)0x0);
          return extraout_EAX;
        }
        return connection_cb_called;
      }
      goto LAB_001adf67;
    }
  }
  else {
    auStack_68._0_8_ = (void *)0x1adf58;
    connection_cb2_cold_1();
  }
  auStack_68._0_8_ = (void *)0x1adf67;
  connection_cb2_cold_2();
LAB_001adf67:
  iVar1 = (int)auStack_68 + 0x10;
  auStack_68._0_8_ = connect_cb2;
  connection_cb2_cold_3();
  auStack_68._0_8_ = SEXT48(iVar1);
  if ((void *)auStack_68._0_8_ != (void *)0xffffffffffffff83) {
    handle_00 = (uv_handle_t *)auStack_68;
    connect_cb2_cold_1();
    iVar1 = uv_is_closing(handle_00);
    if (iVar1 != 0) {
      return iVar1;
    }
    uv_close(handle_00,(uv_close_cb)0x0);
    return extraout_EAX_01;
  }
  connect_cb_called = connect_cb_called + 1;
  if ((connect_cb_called == 10) && (connection_cb_called == 10)) {
    uv_close((uv_handle_t *)&server_handle,(uv_close_cb)0x0);
    return extraout_EAX_00;
  }
  return connect_cb_called;
}

Assistant:

TEST_IMPL(pipe_connect_close_multiple) {
#if defined(NO_SELF_CONNECT)
  RETURN_SKIP(NO_SELF_CONNECT);
#endif
  int i;
  int r;
  uv_loop_t* loop;

  loop = uv_default_loop();

  r = uv_pipe_init(loop, &server_handle, 0);
  ASSERT_OK(r);

  r = uv_pipe_bind(&server_handle, TEST_PIPENAME);
  ASSERT_OK(r);

  r = uv_listen((uv_stream_t*)&server_handle, 128, connection_cb2);
  ASSERT_OK(r);

  for (i = 0; i < NUM_CLIENTS; i++) {
    r = uv_pipe_init(loop, &clients[i].pipe_handle, 0);
    ASSERT_OK(r);
    uv_pipe_connect(&clients[i].conn_req,
                    &clients[i].pipe_handle,
                    TEST_PIPENAME,
                    connect_cb2);
  }

  for (i = 0; i < NUM_CLIENTS; i++) {
    uv_close((uv_handle_t*)&clients[i].pipe_handle, NULL);
  }


  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_EQ(connection_cb_called, NUM_CLIENTS);
  ASSERT_EQ(connect_cb_called, NUM_CLIENTS);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}